

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

Am_Point_List compute_arrowhead(Am_Point_List *pl)

{
  char cVar1;
  Am_Add_Position AVar2;
  Am_Point_List *pAVar3;
  Am_Point_Item *extraout_RDX;
  Am_Point_Item *extraout_RDX_00;
  Am_Point_Item *pAVar4;
  int iVar5;
  int *in_RSI;
  int iVar6;
  double dVar7;
  Am_Point_List AVar8;
  int y1;
  int x1;
  int y2;
  int x2;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  Am_Point_List local_40;
  
  Am_Point_List::Start();
  cVar1 = Am_Point_List::Last();
  if (cVar1 == '\0') {
    Am_Point_List::Get(in_RSI,&local_68);
    do {
      Am_Point_List::Next();
      cVar1 = Am_Point_List::Last();
      if (cVar1 == '\0') {
        Am_Point_List::Get(in_RSI,&local_60);
      }
      else {
        local_60 = local_68 + 1;
        local_64 = local_6c;
      }
      iVar5 = local_60 - local_68;
    } while ((iVar5 == 0) && (local_64 == local_6c));
    iVar6 = local_64 - local_6c;
    dVar7 = (double)(iVar6 * iVar6 + iVar5 * iVar5);
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    local_4c = 5.0 / (float)dVar7;
    local_50 = (float)iVar5;
    local_5c = (float)iVar6 * 0.5;
    local_58 = local_50 * -0.8660254;
    local_44 = (local_58 - local_5c) * local_4c;
    local_54 = (float)iVar6 * -0.8660254;
    local_48 = (local_50 * 0.5 + local_54) * local_4c;
    Am_Point_List::Am_Point_List(&local_40);
    AVar2 = Am_Point_List::Add((float)((int)local_44 + local_68),(float)((int)local_48 + local_6c),
                               (Am_Add_Position)&local_40,true);
    AVar2 = Am_Point_List::Add((float)local_68,(float)local_6c,AVar2,true);
    pAVar3 = (Am_Point_List *)
             Am_Point_List::Add((float)((int)((local_58 + local_5c) * local_4c) + local_68),
                                (float)((int)((local_50 * -0.5 + local_54) * local_4c) + local_6c),
                                AVar2,true);
    Am_Point_List::Am_Point_List(pl,pAVar3);
    Am_Point_List::~Am_Point_List(&local_40);
    pAVar4 = extraout_RDX_00;
  }
  else {
    pl->data = (Am_Point_List_Data *)0x0;
    pAVar4 = extraout_RDX;
  }
  AVar8.item = pAVar4;
  AVar8.data = (Am_Point_List_Data *)pl;
  return AVar8;
}

Assistant:

Am_Point_List
compute_arrowhead(Am_Point_List pl)
{
  int x1, y1, x2, y2;

  // get the first two distinct points out of pl into (x1,y1) and (x2,y2)
  pl.Start();
  if (pl.Last())
    return nullptr;
  pl.Get(x1, y1);

  do {
    pl.Next();
    if (pl.Last()) {
      x2 = x1 + 1;
      y2 = y1;
    } else
      pl.Get(x2, y2);

  } while (x1 == x2 && y1 == y2);

  // compute a 60 degree angle with vertex at x1,y1, pointing toward x2,y2
  int dx = x2 - x1;
  int dy = y2 - y1;
  float d = sqrt((double)(dx * dx + dy * dy));
  float scale = ARROWHEAD_LENGTH / d;

  const float a = 0.8660254037844; // cos(30 deg)
  const float b = 0.5;             // sin(30 deg)

  float dxa = (-a * dx - b * dy) * scale;
  float dya = (b * dx - a * dy) * scale;
  float dxb = (-a * dx + b * dy) * scale;
  float dyb = (-b * dx - a * dy) * scale;

  return Am_Point_List()
      .Add(x1 + (int)dxa, y1 + (int)dya)
      .Add(x1, y1)
      .Add(x1 + (int)dxb, y1 + (int)dyb);
}